

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Visitor.h
# Opt level: O3

void __thiscall
Eigen::DenseBase<Eigen::Matrix<float,32,1,0,32,1>>::
visit<Eigen::internal::max_coeff_visitor<Eigen::Matrix<float,32,1,0,32,1>>>
          (DenseBase<Eigen::Matrix<float,32,1,0,32,1>> *this,
          max_coeff_visitor<Eigen::Matrix<float,_32,_1,_0,_32,_1>_> *visitor)

{
  float fVar1;
  float fVar2;
  ThisEvaluator thisEval;
  visitor_evaluator<Eigen::Matrix<float,_32,_1,_0,_32,_1>_> local_28;
  
  local_28.m_evaluator.
  super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<float,_32,_1,_0,_32,_1>_>_>.m_data =
       (Scalar *)this;
  local_28.m_xpr = (Matrix<float,_32,_1,_0,_32,_1> *)this;
  internal::
  visitor_impl<Eigen::internal::max_coeff_visitor<Eigen::Matrix<float,_32,_1,_0,_32,_1>_>,_Eigen::internal::visitor_evaluator<Eigen::Matrix<float,_32,_1,_0,_32,_1>_>,_24>
  ::run(&local_28,visitor);
  fVar1 = *(float *)((long)local_28.m_evaluator.
                           super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<float,_32,_1,_0,_32,_1>_>_>
                           .m_data + 0x60);
  fVar2 = (visitor->super_coeff_visitor<Eigen::Matrix<float,_32,_1,_0,_32,_1>_>).res;
  if (fVar2 < fVar1) {
    (visitor->super_coeff_visitor<Eigen::Matrix<float,_32,_1,_0,_32,_1>_>).res = fVar1;
    (visitor->super_coeff_visitor<Eigen::Matrix<float,_32,_1,_0,_32,_1>_>).row = 0x18;
    (visitor->super_coeff_visitor<Eigen::Matrix<float,_32,_1,_0,_32,_1>_>).col = 0;
    fVar2 = fVar1;
  }
  fVar1 = *(float *)((long)local_28.m_evaluator.
                           super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<float,_32,_1,_0,_32,_1>_>_>
                           .m_data + 100);
  if (fVar2 < fVar1) {
    (visitor->super_coeff_visitor<Eigen::Matrix<float,_32,_1,_0,_32,_1>_>).res = fVar1;
    (visitor->super_coeff_visitor<Eigen::Matrix<float,_32,_1,_0,_32,_1>_>).row = 0x19;
    (visitor->super_coeff_visitor<Eigen::Matrix<float,_32,_1,_0,_32,_1>_>).col = 0;
    fVar2 = fVar1;
  }
  fVar1 = *(float *)((long)local_28.m_evaluator.
                           super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<float,_32,_1,_0,_32,_1>_>_>
                           .m_data + 0x68);
  if (fVar2 < fVar1) {
    (visitor->super_coeff_visitor<Eigen::Matrix<float,_32,_1,_0,_32,_1>_>).res = fVar1;
    (visitor->super_coeff_visitor<Eigen::Matrix<float,_32,_1,_0,_32,_1>_>).row = 0x1a;
    (visitor->super_coeff_visitor<Eigen::Matrix<float,_32,_1,_0,_32,_1>_>).col = 0;
    fVar2 = fVar1;
  }
  fVar1 = *(float *)((long)local_28.m_evaluator.
                           super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<float,_32,_1,_0,_32,_1>_>_>
                           .m_data + 0x6c);
  if (fVar2 < fVar1) {
    (visitor->super_coeff_visitor<Eigen::Matrix<float,_32,_1,_0,_32,_1>_>).res = fVar1;
    (visitor->super_coeff_visitor<Eigen::Matrix<float,_32,_1,_0,_32,_1>_>).row = 0x1b;
    (visitor->super_coeff_visitor<Eigen::Matrix<float,_32,_1,_0,_32,_1>_>).col = 0;
    fVar2 = fVar1;
  }
  fVar1 = *(float *)((long)local_28.m_evaluator.
                           super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<float,_32,_1,_0,_32,_1>_>_>
                           .m_data + 0x70);
  if (fVar2 < fVar1) {
    (visitor->super_coeff_visitor<Eigen::Matrix<float,_32,_1,_0,_32,_1>_>).res = fVar1;
    (visitor->super_coeff_visitor<Eigen::Matrix<float,_32,_1,_0,_32,_1>_>).row = 0x1c;
    (visitor->super_coeff_visitor<Eigen::Matrix<float,_32,_1,_0,_32,_1>_>).col = 0;
    fVar2 = fVar1;
  }
  fVar1 = *(float *)((long)local_28.m_evaluator.
                           super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<float,_32,_1,_0,_32,_1>_>_>
                           .m_data + 0x74);
  if (fVar2 < fVar1) {
    (visitor->super_coeff_visitor<Eigen::Matrix<float,_32,_1,_0,_32,_1>_>).res = fVar1;
    (visitor->super_coeff_visitor<Eigen::Matrix<float,_32,_1,_0,_32,_1>_>).row = 0x1d;
    (visitor->super_coeff_visitor<Eigen::Matrix<float,_32,_1,_0,_32,_1>_>).col = 0;
    fVar2 = fVar1;
  }
  fVar1 = *(float *)((long)local_28.m_evaluator.
                           super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<float,_32,_1,_0,_32,_1>_>_>
                           .m_data + 0x78);
  if (fVar2 < fVar1) {
    (visitor->super_coeff_visitor<Eigen::Matrix<float,_32,_1,_0,_32,_1>_>).res = fVar1;
    (visitor->super_coeff_visitor<Eigen::Matrix<float,_32,_1,_0,_32,_1>_>).row = 0x1e;
    (visitor->super_coeff_visitor<Eigen::Matrix<float,_32,_1,_0,_32,_1>_>).col = 0;
    fVar2 = fVar1;
  }
  if (fVar2 < *(float *)((long)local_28.m_evaluator.
                               super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<float,_32,_1,_0,_32,_1>_>_>
                               .m_data + 0x7c)) {
    (visitor->super_coeff_visitor<Eigen::Matrix<float,_32,_1,_0,_32,_1>_>).res =
         *(float *)((long)local_28.m_evaluator.
                          super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<float,_32,_1,_0,_32,_1>_>_>
                          .m_data + 0x7c);
    (visitor->super_coeff_visitor<Eigen::Matrix<float,_32,_1,_0,_32,_1>_>).row = 0x1f;
    (visitor->super_coeff_visitor<Eigen::Matrix<float,_32,_1,_0,_32,_1>_>).col = 0;
  }
  return;
}

Assistant:

EIGEN_DEVICE_FUNC
void DenseBase<Derived>::visit(Visitor& visitor) const
{
  typedef typename internal::visitor_evaluator<Derived> ThisEvaluator;
  ThisEvaluator thisEval(derived());
  
  enum {
    unroll =  SizeAtCompileTime != Dynamic
           && SizeAtCompileTime * ThisEvaluator::CoeffReadCost + (SizeAtCompileTime-1) * internal::functor_traits<Visitor>::Cost <= EIGEN_UNROLLING_LIMIT
  };
  return internal::visitor_impl<Visitor, ThisEvaluator, unroll ? int(SizeAtCompileTime) : Dynamic>::run(thisEval, visitor);
}